

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_scopes.cpp
# Opt level: O3

spv_result_t spvtools::val::ValidateScope(ValidationState_t *_,Instruction *inst,uint32_t scope)

{
  CapabilitySet *this;
  ushort uVar1;
  bool bVar2;
  Op opcode;
  int32_t iVar3;
  Instruction *inst_00;
  DiagnosticStream *pDVar4;
  long lVar5;
  char *pcVar6;
  string local_220;
  undefined1 local_200 [5];
  char local_1fb;
  spv_result_t local_30;
  
  uVar1 = (inst->inst_).opcode;
  ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_200,_,scope);
  if (local_1fb == '\0') {
    ValidationState_t::diag((DiagnosticStream *)local_200,_,SPV_ERROR_INVALID_DATA,inst);
    local_220._M_dataplus._M_p = spvOpcodeString((uint)uVar1);
    pDVar4 = DiagnosticStream::operator<<((DiagnosticStream *)local_200,(char **)&local_220);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar4,": expected scope to be a 32-bit int",0x23);
    local_30 = pDVar4->error_;
  }
  else if (local_200[4] == false) {
    this = &_->module_capabilities_;
    bVar2 = EnumSet<spv::Capability>::contains(this,CapabilityShader);
    if ((!bVar2) ||
       (bVar2 = EnumSet<spv::Capability>::contains(this,CapabilityCooperativeMatrixNV), bVar2)) {
      bVar2 = EnumSet<spv::Capability>::contains(this,CapabilityShader);
      if (!bVar2) {
        return SPV_SUCCESS;
      }
      bVar2 = EnumSet<spv::Capability>::contains(this,CapabilityCooperativeMatrixNV);
      if (!bVar2) {
        return SPV_SUCCESS;
      }
      opcode = ValidationState_t::GetIdOpcode(_,scope);
      iVar3 = spvOpcodeIsConstant(opcode);
      if (iVar3 != 0) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_200,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_200,"Scope ids must be constant or specialization constant when ",
                 0x3b);
      pcVar6 = "CooperativeMatrixNV capability is present";
      lVar5 = 0x29;
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_200,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_200,"Scope ids must be OpConstant when Shader capability is ",0x37
                );
      pcVar6 = "present";
      lVar5 = 7;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,pcVar6,lVar5);
  }
  else {
    if ((uint)local_200._0_4_ < 7) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag((DiagnosticStream *)local_200,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_200,"Invalid scope value:\n ",0x16);
    inst_00 = ValidationState_t::FindDef(_,scope);
    ValidationState_t::Disassemble_abi_cxx11_(&local_220,_,inst_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_200,local_220._M_dataplus._M_p,local_220._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
  }
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_200);
  return local_30;
}

Assistant:

spv_result_t ValidateScope(ValidationState_t& _, const Instruction* inst,
                           uint32_t scope) {
  spv::Op opcode = inst->opcode();
  bool is_int32 = false, is_const_int32 = false;
  uint32_t value = 0;
  std::tie(is_int32, is_const_int32, value) = _.EvalInt32IfConst(scope);

  if (!is_int32) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode) << ": expected scope to be a 32-bit int";
  }

  if (!is_const_int32) {
    if (_.HasCapability(spv::Capability::Shader) &&
        !_.HasCapability(spv::Capability::CooperativeMatrixNV)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Scope ids must be OpConstant when Shader capability is "
             << "present";
    }
    if (_.HasCapability(spv::Capability::Shader) &&
        _.HasCapability(spv::Capability::CooperativeMatrixNV) &&
        !spvOpcodeIsConstant(_.GetIdOpcode(scope))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Scope ids must be constant or specialization constant when "
             << "CooperativeMatrixNV capability is present";
    }
  }

  if (is_const_int32 && !IsValidScope(value)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Invalid scope value:\n " << _.Disassemble(*_.FindDef(scope));
  }

  return SPV_SUCCESS;
}